

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,int radix)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  
  uVar9 = CONCAT44(0,radix);
  lVar7 = 0;
  do {
    pcVar5 = this->cursor_;
    if (this->end_ <= pcVar5 + lVar7) goto LAB_0011a8dc;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = number;
    bVar10 = SUB161(auVar3 % auVar2,0);
    bVar11 = bVar10 + 0x57;
    if (SUB168(auVar3 % auVar2,0) < 10) {
      bVar11 = bVar10 | 0x30;
    }
    pcVar5[lVar7] = bVar11;
    lVar7 = lVar7 + 1;
    bVar12 = uVar9 <= number;
    number = number / uVar9;
  } while (bVar12);
  pcVar5 = this->cursor_;
LAB_0011a8dc:
  iVar6 = (int)lVar7;
  if ((iVar6 != 0) && (pcVar8 = pcVar5 + (long)iVar6 + -1, pcVar5 < pcVar8)) {
    do {
      pcVar4 = pcVar5 + 1;
      cVar1 = *pcVar5;
      *pcVar5 = *pcVar8;
      *pcVar8 = cVar1;
      pcVar8 = pcVar8 + -1;
      pcVar5 = pcVar4;
    } while (pcVar4 < pcVar8);
    pcVar5 = this->cursor_;
  }
  this->cursor_ = pcVar5 + iVar6;
  return;
}

Assistant:

void AppendUint64(uint64 number, int radix) {
    int i = 0;
    while (cursor_ + i < end_) {
      const int tmp = number % radix;
      number /= radix;
      cursor_[i] = (tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }